

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O1

bool bech32::anon_unknown_0::CheckCharacters(string *str,vector<int,_std::allocator<int>_> *errors)

{
  char cVar1;
  iterator __position;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (str->_M_string_length != 0) {
    bVar3 = false;
    uVar4 = 0;
    bVar2 = false;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar4];
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        if (bVar2) goto LAB_003e8400;
        bVar3 = true;
      }
      else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
        if (bVar3) {
LAB_003e8400:
          local_3c = (int)uVar4;
          __position._M_current =
               (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (errors,__position,&local_3c);
          }
          else {
            *__position._M_current = local_3c;
            (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
        }
        else {
          bVar2 = true;
        }
      }
      else if ((byte)(cVar1 + 0x81U) < 0xa2) goto LAB_003e8400;
      uVar4 = uVar4 + 1;
    } while (uVar4 < str->_M_string_length);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start ==
           (errors->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckCharacters(const std::string& str, std::vector<int>& errors)
{
    bool lower = false, upper = false;
    for (size_t i = 0; i < str.size(); ++i) {
        unsigned char c{(unsigned char)(str[i])};
        if (c >= 'a' && c <= 'z') {
            if (upper) {
                errors.push_back(i);
            } else {
                lower = true;
            }
        } else if (c >= 'A' && c <= 'Z') {
            if (lower) {
                errors.push_back(i);
            } else {
                upper = true;
            }
        } else if (c < 33 || c > 126) {
            errors.push_back(i);
        }
    }
    return errors.empty();
}